

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib526.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  timeval tVar11;
  int maxfd;
  int running;
  CURL *curl [4];
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_200;
  int local_1fc;
  long local_1f8 [5];
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  local_1f8[2] = 0;
  local_1f8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                  ,0x43,iVar2,uVar5);
  }
  if (iVar2 == 0) {
    lVar10 = 0;
    do {
      lVar6 = curl_easy_init();
      local_1f8[lVar10] = lVar6;
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                      ,0x47);
        iVar2 = 0x7c;
LAB_0010247e:
        lVar10 = 0;
        goto LAB_00102480;
      }
      iVar3 = curl_easy_setopt(lVar6,0x2712,URL);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                      ,0x49,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_0010247e;
      iVar3 = curl_easy_setopt(lVar6,0x29,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                      ,0x4b,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_0010247e;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    lVar10 = curl_multi_init();
    if (lVar10 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                    ,0x4e);
      iVar2 = 0x7b;
    }
    else {
      iVar2 = curl_multi_add_handle(lVar10,local_1f8[0]);
      uVar1 = _stderr;
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        uVar5 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                      ,0x50,iVar2,uVar5);
      }
      if (iVar2 == 0) {
        curl_mfprintf(_stderr,"Start at URL 0\n");
        iVar3 = 0;
        iVar2 = 0;
        do {
          local_200 = -99;
          local_1c8.tv_sec = 1;
          local_1c8.tv_usec = 0;
          iVar4 = curl_multi_perform(lVar10,&local_1fc);
          uVar1 = _stderr;
          if (iVar4 == 0) {
            if (local_1fc < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                            ,0x5c);
              iVar2 = 0x7a;
            }
          }
          else {
            uVar5 = curl_multi_strerror(iVar4);
            curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                          ,0x5c,iVar4,uVar5);
            iVar2 = iVar4;
          }
          iVar4 = 0x12;
          if (iVar2 == 0) {
            tVar11 = tutil_tvnow();
            lVar6 = tutil_tvdiff(tVar11,tv_test_start);
            if (lVar6 < 0xea61) {
              iVar9 = iVar3;
              if (local_1fc == 0) {
                curl_easy_cleanup(local_1f8[iVar3]);
                local_1f8[iVar3] = 0;
                iVar9 = iVar3 + 1;
                if (iVar3 < 3) {
                  curl_mfprintf(_stderr,"Advancing to URL %d\n",iVar9);
                  iVar3 = curl_multi_add_handle(lVar10,local_1f8[iVar9]);
                  uVar1 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar5 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                                  ,0x78,iVar3,uVar5);
                    iVar2 = iVar3;
                  }
                  iVar3 = iVar9;
                  if (iVar2 == 0) goto LAB_001025ff;
                }
                else {
                  iVar2 = 0;
                  iVar4 = 0x23;
                  iVar3 = iVar9;
                }
              }
              else {
LAB_001025ff:
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                iVar2 = curl_multi_fdset(lVar10,&local_b8,&local_138,&local_1b8,&local_200);
                uVar1 = _stderr;
                if (iVar2 == 0) {
                  iVar2 = 0;
                  if (local_200 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                                  ,0x84);
                    iVar2 = 0x7a;
                  }
                }
                else {
                  uVar5 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                                ,0x84,iVar2,uVar5);
                }
                iVar3 = iVar9;
                if (iVar2 == 0) {
                  iVar2 = select_wrapper(local_200 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
                  if (iVar2 == -1) {
                    piVar7 = __errno_location();
                    iVar2 = *piVar7;
                    local_1d0 = _stderr;
                    pcVar8 = strerror(iVar2);
                    curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                                  ,0x88,iVar2,pcVar8);
                    iVar2 = 0x79;
                  }
                  else {
                    tVar11 = tutil_tvnow();
                    lVar6 = tutil_tvdiff(tVar11,tv_test_start);
                    iVar2 = 0;
                    if (lVar6 < 0xea61) {
                      iVar4 = 0;
                    }
                    else {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                                    ,0x8a);
                      iVar2 = 0x7d;
                    }
                  }
                }
              }
            }
            else {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib526.c"
                            ,0x5e);
              iVar2 = 0x7d;
            }
          }
        } while (iVar4 == 0);
        if ((iVar4 != 0x23) && (iVar4 != 0x12)) goto LAB_001024a7;
      }
    }
LAB_00102480:
    if (iVar2 != 0) {
      lVar6 = 0;
      do {
        curl_easy_cleanup(local_1f8[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
    curl_multi_cleanup(lVar10);
    curl_global_cleanup();
  }
LAB_001024a7:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int current = 0;
  int i;

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    easy_init(curl[i]);
    /* specify target */
    easy_setopt(curl[i], CURLOPT_URL, URL);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
  }

  multi_init(m);

  multi_add_handle(m, curl[current]);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
#ifdef LIB527
      /* NOTE: this code does not remove the handle from the multi handle
         here, which would be the nice, sane and documented way of working.
         This however tests that the API survives this abuse gracefully. */
      curl_easy_cleanup(curl[current]);
      curl[current] = NULL;
#endif
      if(++current < NUM_HANDLES) {
        fprintf(stderr, "Advancing to URL %d\n", current);
#ifdef LIB532
        /* first remove the only handle we use */
        curl_multi_remove_handle(m, curl[0]);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl[0]);
        easy_setopt(curl[0], CURLOPT_URL, URL);
        /* go verbose */
        easy_setopt(curl[0], CURLOPT_VERBOSE, 1L);

        /* re-add it */
        multi_add_handle(m, curl[0]);
#else
        multi_add_handle(m, curl[current]);
#endif
      }
      else {
        break; /* done */
      }
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#if defined(LIB526)

  /* test 526 and 528 */
  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB527)

  /* test 527 */

  /* Upon non-failure test flow the easy's have already been cleanup'ed. In
     case there is a failure we arrive here with easy's that have not been
     cleanup'ed yet, in this case we have to cleanup them or otherwise these
     will be leaked, let's use undocumented cleanup sequence - type UB */

  if(res)
    for(i=0; i < NUM_HANDLES; i++)
      curl_easy_cleanup(curl[i]);

  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB532)

  /* test 532 */
  /* undocumented cleanup sequence - type UB */

  for(i=0; i < NUM_HANDLES; i++)
    curl_easy_cleanup(curl[i]);
  curl_multi_cleanup(m);
  curl_global_cleanup();

#endif

  return res;
}